

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O0

void file_glob_symbol(t_file_handle *x,t_symbol *spattern)

{
  char cVar1;
  char *filename;
  _outlet *x_00;
  int iVar2;
  size_t sVar3;
  t_symbol *s_00;
  undefined1 local_538 [4];
  int end;
  stat_conflict sb;
  int isdir;
  char *path;
  t_symbol *s;
  size_t i;
  size_t sStack_480;
  int onlydirs;
  size_t patternlen;
  char pattern [1000];
  int local_88;
  int matchdot;
  int flags;
  glob_t gg;
  t_atom outv [2];
  t_symbol *spattern_local;
  t_file_handle *x_local;
  
  local_88 = 0;
  do_expandpath(spattern->s_name,(char *)&patternlen,1000);
  sStack_480 = strlen((char *)&patternlen);
  cVar1 = *(char *)((long)&onlydirs + sStack_480 + 3);
  iVar2 = strcmp(".",(char *)&patternlen);
  if ((((iVar2 == 0) || (iVar2 = strcmp("./",(char *)&patternlen), iVar2 == 0)) ||
      (iVar2 = str_endswith((char *)&patternlen,"/."), iVar2 != 0)) ||
     (iVar2 = str_endswith((char *)&patternlen,"/./"), iVar2 != 0)) {
    local_88 = 1;
  }
  else {
    iVar2 = strcmp("..",(char *)&patternlen);
    if (((iVar2 == 0) || (iVar2 = strcmp("../",(char *)&patternlen), iVar2 == 0)) ||
       ((iVar2 = str_endswith((char *)&patternlen,"/.."), iVar2 != 0 ||
        (iVar2 = str_endswith((char *)&patternlen,"/../"), iVar2 != 0)))) {
      local_88 = 2;
    }
  }
  iVar2 = glob((char *)&patternlen,0,(__errfunc *)0x0,(glob_t *)&matchdot);
  if (iVar2 == 0) {
    for (s = (t_symbol *)0x0; s < _matchdot; s = (t_symbol *)((long)&s->s_name + 1)) {
      filename = *(char **)(gg.gl_pathc + (long)s * 8);
      sb.__glibc_reserved[2]._4_4_ = 0;
      iVar2 = do_file_stat((t_file_handle *)0x0,filename,(stat_conflict *)local_538,(int *)0x0);
      if (iVar2 == 0) {
        sb.__glibc_reserved[2]._4_4_ = (uint)(((uint)sb.st_nlink & 0xf000) == 0x4000);
      }
      if ((cVar1 != '/') || (sb.__glibc_reserved[2]._4_4_ != 0)) {
        sVar3 = strlen(filename);
        if (filename[(int)sVar3 + -1] == '/') {
          filename[(int)sVar3 + -1] = '\0';
        }
        if (((local_88 == 1) ||
            ((iVar2 = strcmp(filename,"."), iVar2 != 0 &&
             (iVar2 = str_endswith(filename,"/."), iVar2 == 0)))) &&
           ((local_88 == 2 ||
            ((iVar2 = strcmp(filename,".."), iVar2 != 0 &&
             (iVar2 = str_endswith(filename,"/.."), iVar2 == 0)))))) {
          gensym(filename);
          gg.gl_stat._0_4_ = 2;
          x_00 = x->x_dataout;
          s_00 = gensym("list");
          outlet_list(x_00,s_00,2,(t_atom *)&gg.gl_stat);
        }
      }
    }
  }
  else {
    outlet_bang(x->x_infoout);
  }
  globfree((glob_t *)&matchdot);
  return;
}

Assistant:

static void file_glob_symbol(t_file_handle*x, t_symbol*spattern) {
    t_atom outv[2];
    glob_t gg;
    int flags = 0;
    int matchdot=0;
    char pattern[MAXPDSTRING];
    size_t patternlen;
    int onlydirs;
    do_expandpath(spattern->s_name, pattern, MAXPDSTRING);
    patternlen=strlen(pattern);
    onlydirs = ('/' == pattern[patternlen-1]);
    if(!strcmp(".", pattern) || !strcmp("./", pattern)
        || str_endswith(pattern, "/.") || str_endswith(pattern, "/./"))
        matchdot=1;
    else if(!strcmp("..", pattern) || !strcmp("../", pattern)
        || str_endswith(pattern, "/..") || str_endswith(pattern, "/../"))
        matchdot=2;
    if(glob(pattern, flags, NULL, &gg)) {
            // this gets triggered if there is no match...
        outlet_bang(x->x_infoout);
    } else {
        size_t i;
        for(i=0; i<gg.gl_pathc; i++) {
            t_symbol *s;
            char*path = gg.gl_pathv[i];
            int isdir = 0;
            struct stat sb;
            int end;
            if(!do_file_stat(0, path, &sb, 0)) {
                isdir = S_ISDIR(sb.st_mode);
            }
            if(onlydirs && !isdir)
                continue;
            end=strlen(path);
            if('/' == path[end-1]) {
                path[end-1]=0;
            }
            if (matchdot!=1 && (!strcmp(path, ".") || str_endswith(path, "/.")))
                continue;
            if (matchdot!=2 && (!strcmp(path, "..") || str_endswith(path, "/..")))
                continue;

            s = gensym(path);
            SETSYMBOL(outv+0, s);
            SETFLOAT(outv+1, isdir);
            outlet_list(x->x_dataout, gensym("list"), 2, outv);
        }
    }
    globfree(&gg);
}